

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O0

int read_ahead_timestamp(FILE *f,hdr_timespec *timestamp,char expected_terminator)

{
  bool bVar1;
  int iVar2;
  long local_48;
  long nsec_multipler;
  long nsec;
  long sec;
  int is_seconds;
  int c;
  char expected_terminator_local;
  hdr_timespec *timestamp_local;
  FILE *f_local;
  
  bVar1 = true;
  nsec = 0;
  nsec_multipler = 0;
  local_48 = 1000000000;
  while( true ) {
    iVar2 = fgetc((FILE *)f);
    if (iVar2 == -1) {
      return 0;
    }
    if (expected_terminator == iVar2) break;
    if (iVar2 == 0x2e) {
      bVar1 = false;
    }
    else {
      if ((iVar2 < 0x30) || (0x39 < iVar2)) {
        return 0;
      }
      if (bVar1) {
        nsec = nsec * 10 + (long)(iVar2 + -0x30);
      }
      else {
        nsec_multipler = nsec_multipler * 10 + (long)(iVar2 + -0x30);
        local_48 = local_48 / 10;
      }
    }
  }
  timestamp->tv_sec = nsec;
  timestamp->tv_nsec = nsec_multipler * local_48;
  return 1;
}

Assistant:

static int read_ahead_timestamp(FILE* f, hdr_timespec* timestamp, char expected_terminator)
{
    int c;
    int is_seconds = 1;
    long sec = 0;
    long nsec = 0;
    long nsec_multipler = 1000000000;

    while (EOF != (c = fgetc(f)))
    {
        if (expected_terminator == c)
        {
            timestamp->tv_sec = sec;
            timestamp->tv_nsec = (nsec * nsec_multipler);
            return 1;
        }
        else if ('.' == c)
        {
            is_seconds = 0;
        }
        else if ('0' <= c && c <= '9')
        {
            if (is_seconds)
            {
                sec = (sec * 10) + (c - '0');
            }
            else
            {
                nsec = (nsec * 10) + (c - '0');
                nsec_multipler /= 10;
            }
        }
        else
        {
            return 0;
        }
    }

    return 0;
}